

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _tree.hpp
# Opt level: O0

void __thiscall
ft::RBTree<int,_ft::allocator<ft::treeNode<int>_>_>::treeInit
          (RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *this)

{
  pointer ptVar1;
  undefined1 *this_00;
  treeNode<int> local_80;
  treeNode<int> local_60;
  treeNode<int> local_30;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *local_10;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *this_local;
  
  this_00 = &this->field_0x20;
  local_10 = this;
  ptVar1 = allocator<ft::treeNode<int>_>::allocate((allocator<ft::treeNode<int>_> *)this_00,1);
  this->NIL = ptVar1;
  ptVar1 = allocator<ft::treeNode<int>_>::allocate((allocator<ft::treeNode<int>_> *)this_00,1);
  this->m_first = ptVar1;
  ptVar1 = allocator<ft::treeNode<int>_>::allocate((allocator<ft::treeNode<int>_> *)this_00,1);
  this->m_last = ptVar1;
  ptVar1 = this->NIL;
  treeNode<int>::treeNode(&local_30,BLACK);
  allocator<ft::treeNode<int>_>::construct
            ((allocator<ft::treeNode<int>_> *)this_00,ptVar1,&local_30);
  treeNode<int>::~treeNode(&local_30);
  ptVar1 = this->m_first;
  treeNode<int>::treeNode(&local_60,BLACK);
  allocator<ft::treeNode<int>_>::construct
            ((allocator<ft::treeNode<int>_> *)&this->field_0x20,ptVar1,&local_60);
  treeNode<int>::~treeNode(&local_60);
  ptVar1 = this->m_last;
  treeNode<int>::treeNode(&local_80,BLACK);
  allocator<ft::treeNode<int>_>::construct
            ((allocator<ft::treeNode<int>_> *)&this->field_0x20,ptVar1,&local_80);
  treeNode<int>::~treeNode(&local_80);
  this->NIL->parent = this->NIL;
  this->NIL->left = this->NIL;
  this->NIL->right = this->NIL;
  this->m_first->left = this->NIL;
  this->m_first->right = this->NIL;
  this->m_last->left = this->NIL;
  this->m_last->right = this->NIL;
  this->m_root = this->NIL;
  return;
}

Assistant:

void treeInit() {
		this->NIL = this->m_alloc.allocate(1);
		this->m_first = this->m_alloc.allocate(1);
		this->m_last = this->m_alloc.allocate(1);

		this->m_alloc.construct(this->NIL, BLACK);
		this->m_alloc.construct(this->m_first, BLACK);
		this->m_alloc.construct(this->m_last, BLACK);

		this->NIL->parent = this->NIL;
		this->NIL->left = this->NIL;
		this->NIL->right = this->NIL;
		this->m_first->left = this->NIL;
		this->m_first->right = this->NIL;
		this->m_last->left = this->NIL;
		this->m_last->right = this->NIL;

		this->m_root = this->NIL;
	}